

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::setCheckBoxValue(QPDFFormFieldObjectHelper *this,bool value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator key;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  undefined7 in_register_00000031;
  QPDFObjectHandle name;
  string on_value;
  QPDFObjectHandle annot;
  QPDFObjectHandle AP;
  allocator<char> local_e9;
  string local_e8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined4 local_b4;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  QPDFFormFieldObjectHelper *local_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000031,value);
  local_80 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0._M_local_buf,"/AP",(allocator<char> *)(local_90 + 0x18));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_68 + 0x10),&local_e8);
  std::__cxx11::string::~string((string *)local_a0._M_local_buf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)(local_68 + 0x10));
  local_48 = this;
  if (bVar2) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0._M_local_buf,"/Kids",(allocator<char> *)&local_c8);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b0,&local_e8);
    std::__cxx11::string::~string((string *)local_a0._M_local_buf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_68,local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0._M_local_buf,"/Kids",&local_e9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c8,(string *)local_68);
    QPDFObjectHandle::as_array((Array *)&local_e8,(QPDFObjectHandle *)&local_c8,strict);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    std::__cxx11::string::~string((string *)local_a0._M_local_buf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    key = ::qpdf::Array::begin((Array *)&local_e8);
    iVar3 = ::qpdf::Array::end((Array *)&local_e8);
    for (; key._M_current != iVar3._M_current;
        key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0._M_local_buf,"/AP",(allocator<char> *)local_68);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c8,(string *)key._M_current);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),&local_c8
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__cxx11::string::~string((string *)local_a0._M_local_buf);
      bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)(local_68 + 0x10));
      if (!bVar2) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18),
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current);
        break;
      }
    }
    ::qpdf::Array::~Array((Array *)&local_e8);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a0,local_80);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18),
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a0);
    paVar1 = &local_a0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar1->_M_local_buf + 8));
  local_a0._M_allocated_capacity = (size_type)local_90;
  local_a0._8_8_ = 0;
  local_90[0] = 0;
  if ((char)local_b4 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"/Off",(allocator<char> *)local_68);
  }
  else {
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_68 + 0x10));
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"/N",(allocator<char> *)local_68);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c8,(string *)(local_68 + 0x10));
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_b0,&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__cxx11::string::~string((string *)&local_e8);
      iVar4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)local_b0);
      iVar5 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)local_b0);
      for (; iVar4._M_node != iVar5._M_node;
          iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar4._M_node + 1),"/Off");
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)local_a0._M_local_buf);
          break;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    }
    if (local_a0._8_8_ == 0) {
      std::__cxx11::string::assign(local_a0._M_local_buf);
    }
    std::__cxx11::string::string((string *)&local_e8,(string *)local_a0._M_local_buf);
  }
  QPDFObjectHandle::newName((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"/V",(allocator<char> *)&local_c8);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
  setFieldAttribute(local_48,&local_e8,(QPDFObjectHandle *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string((string *)&local_e8);
  if (local_78._M_ptr == (element_type *)0x0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_c8,local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"unable to set the value of this checkbox",&local_e9);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"/AS",(allocator<char> *)&local_c8);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)(local_90 + 0x18),&local_e8,(QPDFObjectHandle *)local_b0);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  std::__cxx11::string::~string((string *)local_a0._M_local_buf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setCheckBoxValue(bool value)
{
    QPDFObjectHandle AP = oh().getKey("/AP");
    QPDFObjectHandle annot;
    if (AP.null()) {
        // The widget may be below. If there is more than one, just
        // find the first one.
        QPDFObjectHandle kids = oh().getKey("/Kids");
        for (auto const& kid: oh().getKey("/Kids").as_array(qpdf::strict)) {
            AP = kid.getKey("/AP");
            if (!AP.null()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper checkbox kid widget");
                annot = kid;
                break;
            }
        }
    } else {
        annot = oh();
    }
    std::string on_value;
    if (value) {
        // Set the "on" value to the first value in the appearance stream's normal state dictionary
        // that isn't /Off. If not found, fall back to /Yes.
        if (AP.isDictionary()) {
            for (auto const& item: AP.getKey("/N").as_dictionary()) {
                if (item.first != "/Off") {
                    on_value = item.first;
                    break;
                }
            }
        }
        if (on_value.empty()) {
            on_value = "/Yes";
        }
    }

    // Set /AS to the on value or /Off in addition to setting /V.
    QPDFObjectHandle name = QPDFObjectHandle::newName(value ? on_value : "/Off");
    setFieldAttribute("/V", name);
    if (!annot) {
        QTC::TC("qpdf", "QPDFObjectHandle broken checkbox");
        oh().warnIfPossible("unable to set the value of this checkbox");
        return;
    }
    QTC::TC("qpdf", "QPDFFormFieldObjectHelper set checkbox AS");
    annot.replaceKey("/AS", name);
}